

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::makeMemoryFill(TranslateToFuzzReader *this)

{
  uintptr_t uVar1;
  uintptr_t uVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  
  if (this->allowMemory != false) {
    pEVar3 = makePointer(this);
    pEVar4 = make(this,(Type)0x2);
    pEVar5 = make(this,(Type)*(uintptr_t *)(**(long **)(this->wasm + 0x78) + 0x50));
    uVar1 = *(uintptr_t *)**(long **)(this->wasm + 0x78);
    uVar2 = ((uintptr_t *)**(long **)(this->wasm + 0x78))[1];
    pEVar6 = (Expression *)
             MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x38,8);
    *(undefined8 *)pEVar6 = 0;
    (pEVar6->type).id = 0;
    *(undefined8 *)(pEVar6 + 1) = 0;
    pEVar6[1].type.id = 0;
    *(undefined8 *)(pEVar6 + 2) = 0;
    pEVar6[2].type.id = 0;
    *(undefined8 *)(pEVar6 + 3) = 0;
    pEVar6->_id = MemoryFillId;
    (pEVar6->type).id = 0;
    *(Expression **)(pEVar6 + 1) = pEVar3;
    pEVar6[1].type.id = (uintptr_t)pEVar4;
    *(Expression **)(pEVar6 + 2) = pEVar5;
    pEVar6[2].type.id = uVar1;
    *(uintptr_t *)(pEVar6 + 3) = uVar2;
    wasm::MemoryFill::finalize();
    return pEVar6;
  }
  pEVar3 = makeTrivial(this,(Type)0x0);
  return pEVar3;
}

Assistant:

Expression* TranslateToFuzzReader::makeMemoryFill() {
  if (!allowMemory) {
    return makeTrivial(Type::none);
  }
  Expression* dest = makePointer();
  Expression* value = make(Type::i32);
  Expression* size = make(wasm.memories[0]->addressType);
  return builder.makeMemoryFill(dest, value, size, wasm.memories[0]->name);
}